

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::String> * __thiscall
kj::anon_unknown_36::WebSocketImpl::getPreferredExtensions
          (Maybe<kj::String> *__return_storage_ptr__,WebSocketImpl *this,ExtensionsContext ctx)

{
  bool bVar1;
  anon_union_40_1_a8c68091_for_NullableValue<kj::CompressionParameters>_2 *paVar2;
  CompressionParameters *__return_storage_ptr___00;
  CompressionParameters arr [1];
  CompressionParameters local_68;
  ArrayPtr<kj::CompressionParameters> local_38;
  String local_28;
  
  local_38.ptr = &local_68;
  __return_storage_ptr___00 = &local_68;
  if ((this->maskKeyGenerator).ptr == (EntropySource *)0x0) {
    if (ctx != REQUEST) goto LAB_003b05e7;
    if ((this->compressionConfig).ptr.isSet != true) goto LAB_003b061d;
    kj::_::generateExtensionResponse
              ((String *)&local_68,&(this->compressionConfig).ptr.field_1.value);
  }
  else {
    if (ctx != RESPONSE) {
LAB_003b05e7:
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    bVar1 = (this->compressionConfig).ptr.isSet;
    paVar2 = (anon_union_40_1_a8c68091_for_NullableValue<kj::CompressionParameters>_2 *)0x0;
    if (bVar1 != false) {
      paVar2 = &(this->compressionConfig).ptr.field_1;
    }
    if (bVar1 != true) {
LAB_003b061d:
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.content.ptr = (char *)0x0;
      (__return_storage_ptr__->ptr).field_1.value.content.size_ = 0;
      (__return_storage_ptr__->ptr).field_1.value.content.disposer = (ArrayDisposer *)0x0;
      return __return_storage_ptr__;
    }
    local_68._0_2_ = *(undefined2 *)paVar2;
    local_68.outboundMaxWindowBits.ptr.isSet = (paVar2->value).outboundMaxWindowBits.ptr.isSet;
    if (local_68.outboundMaxWindowBits.ptr.isSet == true) {
      local_68.outboundMaxWindowBits.ptr.field_1 =
           *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)((long)paVar2 + 0x10);
    }
    local_68.inboundMaxWindowBits.ptr.isSet = (paVar2->value).inboundMaxWindowBits.ptr.isSet;
    if (local_68.inboundMaxWindowBits.ptr.isSet == true) {
      local_68.inboundMaxWindowBits.ptr.field_1 =
           *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)((long)paVar2 + 0x20);
    }
    local_38.size_ = 1;
    __return_storage_ptr___00 = (CompressionParameters *)&local_28;
    kj::_::generateExtensionRequest((String *)__return_storage_ptr___00,&local_38);
  }
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.content.ptr =
       (((String *)__return_storage_ptr___00)->content).ptr;
  (__return_storage_ptr__->ptr).field_1.value.content.size_ =
       (((String *)__return_storage_ptr___00)->content).size_;
  (__return_storage_ptr__->ptr).field_1.value.content.disposer =
       (((String *)__return_storage_ptr___00)->content).disposer;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::String> getPreferredExtensions(ExtensionsContext ctx) override {
    if (maskKeyGenerator == kj::none) {
      // `this` is the server side of a websocket.
      if (ctx == ExtensionsContext::REQUEST) {
        // The other WebSocket is (going to be) the client side of a WebSocket, i.e. this is a
        // proxying pass-through scenario. Optimization is possible. Confusingly, we have to use
        // generateExtensionResponse() (even though we're generating headers to be passed in a
        // request) because this is the function that correctly maps our config's inbound/outbound
        // to client/server.
        KJ_IF_SOME(c, compressionConfig) {
          return _::generateExtensionResponse(c);
        } else {
          return kj::String(nullptr);  // recommend no compression
        }
      } else {
        // We're apparently arranging to pump from the server side of one WebSocket to the server
        // side of another; i.e., we are a server, we have two clients, and we're trying to pump
        // between them. We cannot optimize this case, because the masking requirements are
        // different for client->server vs. server->client messages. Since we have to parse out
        // the messages anyway there's no point in trying to match extensions, so return null.
        return kj::none;
      }
    }